

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingCase::GeometryShaderRenderingCase
          (GeometryShaderRenderingCase *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderRenderingCase *this_local;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderRenderingCase_03260960;
  this->m_context = context;
  this->m_instanced_raw_arrays_bo_id = 0;
  this->m_instanced_unordered_arrays_bo_id = 0;
  this->m_instanced_unordered_elements_bo_id = 0;
  this->m_noninstanced_raw_arrays_bo_id = 0;
  this->m_noninstanced_unordered_arrays_bo_id = 0;
  this->m_noninstanced_unordered_elements_bo_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_renderingTargetSize_uniform_location = 0;
  this->m_singleRenderingTargetSize_uniform_location = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  this->m_fbo_id = 0;
  this->m_read_fbo_id = 0;
  this->m_to_id = 0;
  this->m_instanced_fbo_id = 0;
  this->m_instanced_read_fbo_id = 0;
  this->m_instanced_to_id = 0;
  return;
}

Assistant:

GeometryShaderRenderingCase::GeometryShaderRenderingCase(Context& context, const ExtParameters& extParams,
														 const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_context(context)
	, m_instanced_raw_arrays_bo_id(0)
	, m_instanced_unordered_arrays_bo_id(0)
	, m_instanced_unordered_elements_bo_id(0)
	, m_noninstanced_raw_arrays_bo_id(0)
	, m_noninstanced_unordered_arrays_bo_id(0)
	, m_noninstanced_unordered_elements_bo_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_renderingTargetSize_uniform_location(0)
	, m_singleRenderingTargetSize_uniform_location(0)
	, m_vao_id(0)
	, m_vs_id(0)
	, m_fbo_id(0)
	, m_read_fbo_id(0)
	, m_to_id(0)
	, m_instanced_fbo_id(0)
	, m_instanced_read_fbo_id(0)
	, m_instanced_to_id(0)
{
	/* Left blank intentionally */
}